

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriangleEstimators.h
# Opt level: O0

Estimates * CountExactTriangles(Estimates *__return_storage_ptr__,CGraph *cg)

{
  CGraph g;
  CGraph g_00;
  CGraph g_01;
  VertexIdx *in_stack_fffffffffffffee8;
  Estimates *output;
  TriangleInfo local_a0;
  long local_88;
  TriangleInfo info;
  CDAG dag;
  CGraph cg_relabel;
  CGraph *cg_local;
  
  Estimates::Estimates(__return_storage_ptr__);
  Escape::CGraph::sortById(cg);
  Escape::CGraph::renameByDegreeOrder((CGraph *)&dag.inlist.nbors,cg);
  Escape::CGraph::sortById((CGraph *)&dag.inlist.nbors);
  degreeOrdered((CDAG *)&info.perEdge,(CGraph *)&dag.inlist.nbors);
  Escape::CGraph::sortById((CGraph *)&info.perEdge);
  betterWedgeEnumerator(&local_a0,(CGraph *)&info.perEdge);
  local_88 = local_a0.total;
  info.total = (Count)local_a0.perVertex;
  info.perVertex = local_a0.perEdge;
  __return_storage_ptr__->estimate = (double)local_a0.total;
  g.nEdges = dag.inlist.nEdges;
  g.nVertices = dag.inlist.nVertices;
  g.offsets = dag.inlist.offsets;
  g.nbors = in_stack_fffffffffffffee8;
  Escape::delCGraph(g);
  g_00.nEdges = dag.outlist.nEdges;
  g_00.nVertices = dag.outlist.nVertices;
  g_00.offsets = dag.outlist.offsets;
  g_00.nbors = in_stack_fffffffffffffee8;
  Escape::delCGraph(g_00);
  g_01.nEdges = cg_relabel.nEdges;
  g_01.nVertices = cg_relabel.nVertices;
  g_01.offsets = cg_relabel.offsets;
  g_01.nbors = in_stack_fffffffffffffee8;
  Escape::delCGraph(g_01);
  return __return_storage_ptr__;
}

Assistant:

Estimates CountExactTriangles (CGraph *cg)
{
//    printf ("Exactly counting the number of triangles...\n");

    Estimates output;
    cg->sortById();
    CGraph cg_relabel = cg->renameByDegreeOrder();
    cg_relabel.sortById();
    CDAG dag = degreeOrdered(&cg_relabel);
    (dag.outlist).sortById();

    //printf("Conversion comple. Going to count triangles now. \n");
    TriangleInfo info;
    info = betterWedgeEnumerator(&(dag.outlist));
    output.estimate = info.total;

    // Free up the memory
    delCGraph(dag.inlist);
    delCGraph(dag.outlist);
    delCGraph(cg_relabel);
    //printf ("  Triangle=%lld ",info.total);
    return output;
}